

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_skey.c
# Opt level: O0

void CAST_set_key(CAST_KEY *key,int len,uchar *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint z [16];
  uint x [16];
  int local_14c;
  uint *local_148;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118 [16];
  uint auStack_d8 [25];
  int i;
  uint *K;
  uint l;
  uint Z [4];
  uint X [4];
  int local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  int local_c;
  
  for (local_14c = 0; local_14c < 0x10; local_14c = local_14c + 1) {
    Z[(long)local_14c + 2] = 0;
  }
  local_c = len;
  if (0x10 < len) {
    local_c = 0x10;
  }
  for (local_14c = 0; local_14c < local_c; local_14c = local_14c + 1) {
    Z[(long)local_14c + 2] = (uint)data[local_14c];
  }
  if (local_c < 0xb) {
    key->short_key = 1;
  }
  else {
    key->short_key = 0;
  }
  local_148 = local_118;
  local_128 = Z[2] << 0x18 | Z[3] << 0x10 | X[0] << 8 | X[1];
  local_124 = X[2] << 0x18 | X[3] << 0x10 | local_40 << 8 | local_3c;
  local_120 = local_38 << 0x18 | local_34 << 0x10 | local_30 << 8 | local_2c;
  local_11c = local_28 << 0x18 | local_24 << 0x10 | local_20 << 8 | local_1c;
  while( true ) {
    uVar1 = local_128 ^ CAST_S_table4[local_24] ^ CAST_S_table5[local_1c] ^ CAST_S_table6[local_28]
            ^ CAST_S_table7[local_20] ^ CAST_S_table6[local_38];
    uVar2 = uVar1 & 0xff;
    uVar3 = uVar1 >> 8 & 0xff;
    uVar4 = uVar1 >> 0x10 & 0xff;
    uVar5 = uVar1 >> 0x18;
    uVar6 = local_120 ^ CAST_S_table4[uVar5] ^ CAST_S_table5[uVar3] ^ CAST_S_table6[uVar4] ^
            CAST_S_table7[uVar2] ^ CAST_S_table7[local_30];
    uVar7 = uVar6 & 0xff;
    uVar8 = uVar6 >> 8 & 0xff;
    uVar9 = uVar6 >> 0x10 & 0xff;
    uVar10 = uVar6 >> 0x18;
    uVar11 = local_11c ^ CAST_S_table4[uVar7] ^ CAST_S_table5[uVar8] ^ CAST_S_table6[uVar9] ^
             CAST_S_table7[uVar10] ^ CAST_S_table4[local_34];
    uVar12 = uVar11 >> 8 & 0xff;
    uVar13 = uVar11 >> 0x10 & 0xff;
    uVar14 = local_124 ^ CAST_S_table4[uVar12] ^ CAST_S_table5[uVar13] ^
             CAST_S_table6[uVar11 & 0xff] ^ CAST_S_table7[uVar11 >> 0x18] ^ CAST_S_table5[local_2c];
    *local_148 = CAST_S_table4[uVar11 >> 0x18] ^ CAST_S_table5[uVar13] ^ CAST_S_table6[uVar7] ^
                 CAST_S_table7[uVar8] ^ CAST_S_table4[uVar3];
    local_148[1] = CAST_S_table4[uVar12] ^ CAST_S_table5[uVar11 & 0xff] ^ CAST_S_table6[uVar9] ^
                   CAST_S_table7[uVar10] ^ CAST_S_table5[uVar8];
    local_148[2] = CAST_S_table4[uVar14 >> 0x18] ^ CAST_S_table5[uVar14 >> 0x10 & 0xff] ^
                   CAST_S_table6[uVar2] ^ CAST_S_table7[uVar3] ^ CAST_S_table6[uVar13];
    local_148[3] = CAST_S_table4[uVar14 >> 8 & 0xff] ^ CAST_S_table5[uVar14 & 0xff] ^
                   CAST_S_table6[uVar4] ^ CAST_S_table7[uVar5] ^ CAST_S_table7[uVar14 >> 0x18];
    uVar5 = uVar11 ^ CAST_S_table4[uVar9] ^ CAST_S_table5[uVar7] ^ CAST_S_table6[uVar10] ^
            CAST_S_table7[uVar8] ^ CAST_S_table6[uVar5];
    uVar7 = uVar5 & 0xff;
    uVar8 = uVar5 >> 8 & 0xff;
    uVar9 = uVar5 >> 0x10 & 0xff;
    uVar1 = uVar1 ^ CAST_S_table4[uVar5 >> 0x18] ^ CAST_S_table5[uVar8] ^ CAST_S_table6[uVar9] ^
            CAST_S_table7[uVar7] ^ CAST_S_table7[uVar3];
    uVar3 = uVar1 & 0xff;
    uVar10 = uVar1 >> 8 & 0xff;
    uVar11 = uVar1 >> 0x10 & 0xff;
    uVar4 = uVar6 ^ CAST_S_table4[uVar3] ^ CAST_S_table5[uVar10] ^ CAST_S_table6[uVar11] ^
            CAST_S_table7[uVar1 >> 0x18] ^ CAST_S_table4[uVar4];
    uVar6 = uVar4 & 0xff;
    uVar12 = uVar4 >> 8 & 0xff;
    uVar13 = uVar4 >> 0x10 & 0xff;
    uVar15 = uVar4 >> 0x18;
    uVar2 = uVar14 ^ CAST_S_table4[uVar12] ^ CAST_S_table5[uVar13] ^ CAST_S_table6[uVar6] ^
            CAST_S_table7[uVar15] ^ CAST_S_table5[uVar2];
    uVar14 = uVar2 >> 8 & 0xff;
    uVar16 = uVar2 >> 0x10 & 0xff;
    local_148[4] = CAST_S_table4[uVar7] ^ CAST_S_table5[uVar8] ^ CAST_S_table6[uVar2 >> 0x18] ^
                   CAST_S_table7[uVar16] ^ CAST_S_table4[uVar15];
    local_148[5] = CAST_S_table4[uVar9] ^ CAST_S_table5[uVar5 >> 0x18] ^ CAST_S_table6[uVar14] ^
                   CAST_S_table7[uVar2 & 0xff] ^ CAST_S_table5[uVar16];
    local_148[6] = CAST_S_table4[uVar3] ^ CAST_S_table5[uVar10] ^ CAST_S_table6[uVar15] ^
                   CAST_S_table7[uVar13] ^ CAST_S_table6[uVar7];
    local_148[7] = CAST_S_table4[uVar11] ^ CAST_S_table5[uVar1 >> 0x18] ^ CAST_S_table6[uVar12] ^
                   CAST_S_table7[uVar6] ^ CAST_S_table7[uVar3];
    uVar3 = uVar5 ^ CAST_S_table4[uVar16] ^ CAST_S_table5[uVar2 & 0xff] ^
            CAST_S_table6[uVar2 >> 0x18] ^ CAST_S_table7[uVar14] ^ CAST_S_table6[uVar15];
    uVar5 = uVar3 & 0xff;
    uVar7 = uVar3 >> 8 & 0xff;
    uVar8 = uVar3 >> 0x10 & 0xff;
    uVar9 = uVar3 >> 0x18;
    uVar4 = uVar4 ^ CAST_S_table4[uVar9] ^ CAST_S_table5[uVar7] ^ CAST_S_table6[uVar8] ^
            CAST_S_table7[uVar5] ^ CAST_S_table7[uVar12];
    uVar10 = uVar4 & 0xff;
    uVar11 = uVar4 >> 8 & 0xff;
    uVar12 = uVar4 >> 0x10 & 0xff;
    uVar14 = uVar4 >> 0x18;
    uVar2 = uVar2 ^ CAST_S_table4[uVar10] ^ CAST_S_table5[uVar11] ^ CAST_S_table6[uVar12] ^
            CAST_S_table7[uVar14] ^ CAST_S_table4[uVar13];
    uVar13 = uVar2 >> 8 & 0xff;
    uVar15 = uVar2 >> 0x10 & 0xff;
    uVar1 = uVar1 ^ CAST_S_table4[uVar13] ^ CAST_S_table5[uVar15] ^ CAST_S_table6[uVar2 & 0xff] ^
            CAST_S_table7[uVar2 >> 0x18] ^ CAST_S_table5[uVar6];
    local_148[8] = CAST_S_table4[uVar5] ^ CAST_S_table5[uVar7] ^ CAST_S_table6[uVar1 >> 0x18] ^
                   CAST_S_table7[uVar1 >> 0x10 & 0xff] ^ CAST_S_table4[uVar15];
    local_148[9] = CAST_S_table4[uVar8] ^ CAST_S_table5[uVar9] ^ CAST_S_table6[uVar1 >> 8 & 0xff] ^
                   CAST_S_table7[uVar1 & 0xff] ^ CAST_S_table5[uVar1 >> 0x18];
    local_148[10] =
         CAST_S_table4[uVar10] ^ CAST_S_table5[uVar11] ^ CAST_S_table6[uVar2 >> 0x18] ^
         CAST_S_table7[uVar15] ^ CAST_S_table6[uVar7];
    local_148[0xb] =
         CAST_S_table4[uVar12] ^ CAST_S_table5[uVar14] ^ CAST_S_table6[uVar13] ^
         CAST_S_table7[uVar2 & 0xff] ^ CAST_S_table7[uVar11];
    local_128 = uVar2 ^ CAST_S_table4[uVar12] ^ CAST_S_table5[uVar10] ^ CAST_S_table6[uVar14] ^
                CAST_S_table7[uVar11] ^ CAST_S_table6[uVar9];
    uVar2 = local_128 & 0xff;
    uVar6 = local_128 >> 8 & 0xff;
    uVar9 = local_128 >> 0x10 & 0xff;
    local_124 = uVar3 ^ CAST_S_table4[local_128 >> 0x18] ^ CAST_S_table5[uVar6] ^
                CAST_S_table6[uVar9] ^ CAST_S_table7[uVar2] ^ CAST_S_table7[uVar7];
    uVar3 = local_124 & 0xff;
    uVar7 = local_124 >> 8 & 0xff;
    uVar10 = local_124 >> 0x10 & 0xff;
    local_120 = uVar4 ^ CAST_S_table4[uVar3] ^ CAST_S_table5[uVar7] ^ CAST_S_table6[uVar10] ^
                CAST_S_table7[local_124 >> 0x18] ^ CAST_S_table4[uVar8];
    local_2c = local_120 & 0xff;
    local_30 = local_120 >> 8 & 0xff;
    local_34 = local_120 >> 0x10 & 0xff;
    local_38 = local_120 >> 0x18;
    local_11c = uVar1 ^ CAST_S_table4[local_30] ^ CAST_S_table5[local_34] ^ CAST_S_table6[local_2c]
                ^ CAST_S_table7[local_38] ^ CAST_S_table5[uVar5];
    local_1c = local_11c & 0xff;
    local_20 = local_11c >> 8 & 0xff;
    local_24 = local_11c >> 0x10 & 0xff;
    local_28 = local_11c >> 0x18;
    local_148[0xc] =
         CAST_S_table4[local_38] ^ CAST_S_table5[local_34] ^ CAST_S_table6[uVar3] ^
         CAST_S_table7[uVar7] ^ CAST_S_table4[uVar2];
    local_148[0xd] =
         CAST_S_table4[local_30] ^ CAST_S_table5[local_2c] ^ CAST_S_table6[uVar10] ^
         CAST_S_table7[local_124 >> 0x18] ^ CAST_S_table5[uVar3];
    local_148[0xe] =
         CAST_S_table4[local_28] ^ CAST_S_table5[local_24] ^ CAST_S_table6[uVar2] ^
         CAST_S_table7[uVar6] ^ CAST_S_table6[local_38];
    local_148[0xf] =
         CAST_S_table4[local_20] ^ CAST_S_table5[local_1c] ^ CAST_S_table6[uVar9] ^
         CAST_S_table7[local_128 >> 0x18] ^ CAST_S_table7[local_24];
    if (local_148 != local_118) break;
    local_148 = local_148 + 0x10;
  }
  for (local_14c = 0; local_14c < 0x10; local_14c = local_14c + 1) {
    key->data[local_14c << 1] = local_118[local_14c];
    key->data[local_14c * 2 + 1] = local_118[local_14c + 0x10] + 0x10 & 0x1f;
  }
  return;
}

Assistant:

void CAST_set_key(CAST_KEY *key, int len, const unsigned char *data)
{
    CAST_LONG x[16];
    CAST_LONG z[16];
    CAST_LONG k[32];
    CAST_LONG X[4], Z[4];
    CAST_LONG l, *K;
    int i;

    for (i = 0; i < 16; i++)
        x[i] = 0;
    if (len > 16)
        len = 16;
    for (i = 0; i < len; i++)
        x[i] = data[i];
    if (len <= 10)
        key->short_key = 1;
    else
        key->short_key = 0;

    K = &k[0];
    X[0] = ((x[0] << 24) | (x[1] << 16) | (x[2] << 8) | x[3]) & 0xffffffffL;
    X[1] = ((x[4] << 24) | (x[5] << 16) | (x[6] << 8) | x[7]) & 0xffffffffL;
    X[2] = ((x[8] << 24) | (x[9] << 16) | (x[10] << 8) | x[11]) & 0xffffffffL;
    X[3] =
        ((x[12] << 24) | (x[13] << 16) | (x[14] << 8) | x[15]) & 0xffffffffL;

    for (;;) {
        l = X[0] ^ S4[x[13]] ^ S5[x[15]] ^ S6[x[12]] ^ S7[x[14]] ^ S6[x[8]];
        CAST_exp(l, Z, z, 0);
        l = X[2] ^ S4[z[0]] ^ S5[z[2]] ^ S6[z[1]] ^ S7[z[3]] ^ S7[x[10]];
        CAST_exp(l, Z, z, 4);
        l = X[3] ^ S4[z[7]] ^ S5[z[6]] ^ S6[z[5]] ^ S7[z[4]] ^ S4[x[9]];
        CAST_exp(l, Z, z, 8);
        l = X[1] ^ S4[z[10]] ^ S5[z[9]] ^ S6[z[11]] ^ S7[z[8]] ^ S5[x[11]];
        CAST_exp(l, Z, z, 12);

        K[0] = S4[z[8]] ^ S5[z[9]] ^ S6[z[7]] ^ S7[z[6]] ^ S4[z[2]];
        K[1] = S4[z[10]] ^ S5[z[11]] ^ S6[z[5]] ^ S7[z[4]] ^ S5[z[6]];
        K[2] = S4[z[12]] ^ S5[z[13]] ^ S6[z[3]] ^ S7[z[2]] ^ S6[z[9]];
        K[3] = S4[z[14]] ^ S5[z[15]] ^ S6[z[1]] ^ S7[z[0]] ^ S7[z[12]];

        l = Z[2] ^ S4[z[5]] ^ S5[z[7]] ^ S6[z[4]] ^ S7[z[6]] ^ S6[z[0]];
        CAST_exp(l, X, x, 0);
        l = Z[0] ^ S4[x[0]] ^ S5[x[2]] ^ S6[x[1]] ^ S7[x[3]] ^ S7[z[2]];
        CAST_exp(l, X, x, 4);
        l = Z[1] ^ S4[x[7]] ^ S5[x[6]] ^ S6[x[5]] ^ S7[x[4]] ^ S4[z[1]];
        CAST_exp(l, X, x, 8);
        l = Z[3] ^ S4[x[10]] ^ S5[x[9]] ^ S6[x[11]] ^ S7[x[8]] ^ S5[z[3]];
        CAST_exp(l, X, x, 12);

        K[4] = S4[x[3]] ^ S5[x[2]] ^ S6[x[12]] ^ S7[x[13]] ^ S4[x[8]];
        K[5] = S4[x[1]] ^ S5[x[0]] ^ S6[x[14]] ^ S7[x[15]] ^ S5[x[13]];
        K[6] = S4[x[7]] ^ S5[x[6]] ^ S6[x[8]] ^ S7[x[9]] ^ S6[x[3]];
        K[7] = S4[x[5]] ^ S5[x[4]] ^ S6[x[10]] ^ S7[x[11]] ^ S7[x[7]];

        l = X[0] ^ S4[x[13]] ^ S5[x[15]] ^ S6[x[12]] ^ S7[x[14]] ^ S6[x[8]];
        CAST_exp(l, Z, z, 0);
        l = X[2] ^ S4[z[0]] ^ S5[z[2]] ^ S6[z[1]] ^ S7[z[3]] ^ S7[x[10]];
        CAST_exp(l, Z, z, 4);
        l = X[3] ^ S4[z[7]] ^ S5[z[6]] ^ S6[z[5]] ^ S7[z[4]] ^ S4[x[9]];
        CAST_exp(l, Z, z, 8);
        l = X[1] ^ S4[z[10]] ^ S5[z[9]] ^ S6[z[11]] ^ S7[z[8]] ^ S5[x[11]];
        CAST_exp(l, Z, z, 12);

        K[8] = S4[z[3]] ^ S5[z[2]] ^ S6[z[12]] ^ S7[z[13]] ^ S4[z[9]];
        K[9] = S4[z[1]] ^ S5[z[0]] ^ S6[z[14]] ^ S7[z[15]] ^ S5[z[12]];
        K[10] = S4[z[7]] ^ S5[z[6]] ^ S6[z[8]] ^ S7[z[9]] ^ S6[z[2]];
        K[11] = S4[z[5]] ^ S5[z[4]] ^ S6[z[10]] ^ S7[z[11]] ^ S7[z[6]];

        l = Z[2] ^ S4[z[5]] ^ S5[z[7]] ^ S6[z[4]] ^ S7[z[6]] ^ S6[z[0]];
        CAST_exp(l, X, x, 0);
        l = Z[0] ^ S4[x[0]] ^ S5[x[2]] ^ S6[x[1]] ^ S7[x[3]] ^ S7[z[2]];
        CAST_exp(l, X, x, 4);
        l = Z[1] ^ S4[x[7]] ^ S5[x[6]] ^ S6[x[5]] ^ S7[x[4]] ^ S4[z[1]];
        CAST_exp(l, X, x, 8);
        l = Z[3] ^ S4[x[10]] ^ S5[x[9]] ^ S6[x[11]] ^ S7[x[8]] ^ S5[z[3]];
        CAST_exp(l, X, x, 12);

        K[12] = S4[x[8]] ^ S5[x[9]] ^ S6[x[7]] ^ S7[x[6]] ^ S4[x[3]];
        K[13] = S4[x[10]] ^ S5[x[11]] ^ S6[x[5]] ^ S7[x[4]] ^ S5[x[7]];
        K[14] = S4[x[12]] ^ S5[x[13]] ^ S6[x[3]] ^ S7[x[2]] ^ S6[x[8]];
        K[15] = S4[x[14]] ^ S5[x[15]] ^ S6[x[1]] ^ S7[x[0]] ^ S7[x[13]];
        if (K != k)
            break;
        K += 16;
    }

    for (i = 0; i < 16; i++) {
        key->data[i * 2] = k[i];
        key->data[i * 2 + 1] = ((k[i + 16]) + 16) & 0x1f;
    }
}